

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O3

size_t string_to_size_t(string *str)

{
  size_t result;
  stringstream ss;
  size_t local_198;
  stringstream local_190 [16];
  ostream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_180,(str->_M_dataplus)._M_p,str->_M_string_length);
  std::istream::_M_extract<unsigned_long>((ulong *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return local_198;
}

Assistant:

size_t string_to_size_t(std::string str) {
    size_t result;
    std::stringstream ss;
    ss << str;
    ss >> result;
    return result;
}